

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O1

bool convertToEnum(QMetaType fromType,void *from,QMetaType toType,void *to)

{
  long lVar1;
  undefined1 uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  optional<unsigned_long_long> oVar7;
  qlonglong value;
  QByteArray local_78;
  QMetaEnum local_58;
  _Storage<unsigned_long_long,_true> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (fromType.d_ptr == (QMetaTypeInterface *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = ((fromType.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar3 == 0) {
      iVar3 = QMetaType::registerHelper(fromType.d_ptr);
    }
  }
  local_40._M_value = 0xffffffffffffffff;
  if ((iVar3 == 0xc) || (iVar3 == 10)) {
    local_58.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = metaEnumFromType(toType);
    pcVar4 = QMetaEnum::name(&local_58);
    if (pcVar4 != (char *)0x0) {
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      if (iVar3 == 10) {
        QString::toUtf8_helper(&local_78,(QString *)from);
      }
      else {
        local_78.d.d = *from;
        local_78.d.ptr = *(char **)((long)from + 8);
        local_78.d.size = *(undefined8 *)((long)from + 0x10);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      pcVar4 = local_78.d.ptr;
      if (local_78.d.ptr == (char *)0x0) {
        pcVar4 = "";
      }
      oVar7 = QMetaEnum::keysToValue64(&local_58,pcVar4);
      bVar6 = ((undefined1  [16])
               oVar7.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long_long> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0;
      if (bVar6) {
        local_40._M_value =
             oVar7.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long_long>._M_payload;
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
        }
      }
      goto LAB_002954e5;
    }
  }
  bVar6 = false;
LAB_002954e5:
  if (bVar6 == false) {
    if (iVar3 == 4) {
      local_40 = *from;
      bVar6 = true;
    }
    else {
      bVar6 = QMetaType::convert(fromType,from,
                                 (QMetaType)
                                 &QtPrivate::QMetaTypeInterfaceWrapper<long_long>::metaType,
                                 &local_40);
    }
  }
  if (bVar6 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return false;
  }
  if (toType.d_ptr == (QMetaTypeInterface *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)(toType.d_ptr)->size;
  }
  lVar1 = 0;
  if (uVar5 != 0) {
    for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
    }
  }
  uVar2 = (*(code *)((long)&DAT_004e2670 + (long)(int)(&DAT_004e2670)[lVar1]))();
  return (bool)uVar2;
}

Assistant:

static bool convertToEnum(QMetaType fromType, const void *from, QMetaType toType, void *to)
{
    int fromTypeId = fromType.id();
    qlonglong value = -1;
    bool ok = false;
#ifndef QT_NO_QOBJECT
    if (fromTypeId == QMetaType::QString || fromTypeId == QMetaType::QByteArray) {
        QMetaEnum en = metaEnumFromType(toType);
        if (en.isValid()) {
            QByteArray keys = (fromTypeId == QMetaType::QString)
                    ? static_cast<const QString *>(from)->toUtf8()
                    : *static_cast<const QByteArray *>(from);
            if (auto v = en.keysToValue64(keys.constData())) {
                ok = true;
                value = *v;
            }
        }
    }
#endif
    if (!ok) {
        if (fromTypeId == QMetaType::LongLong) {
            value = *static_cast<const qlonglong *>(from);
            ok = true;
        } else {
            ok = QMetaType::convert(fromType, from, QMetaType::fromType<qlonglong>(), &value);
        }
    }

    if (!ok)
        return false;

    switch (toType.sizeOf()) {
    case 1:
        *static_cast<signed char *>(to) = value;
        return true;
    case 2:
        *static_cast<qint16 *>(to) = value;
        return true;
    case 4:
        *static_cast<qint32 *>(to) = value;
        return true;
    case 8:
        *static_cast<qint64 *>(to) = value;
        return true;
    default:
        Q_UNREACHABLE_RETURN(false);
    }
}